

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EvalContext.cpp
# Opt level: O0

void __thiscall slang::ast::EvalContext::reportStack(EvalContext *this,Diagnostic *diag)

{
  bool bVar1;
  Compilation *this_00;
  CompilationOptions *pCVar2;
  size_type sVar3;
  pointer pFVar4;
  Diagnostic *this_01;
  SourceLocation in_RSI;
  long in_RDI;
  Frame *in_stack_00000028;
  Diagnostic *in_stack_00000030;
  reverse_iterator<const_slang::ast::EvalContext::Frame_*> itEnd_1;
  reverse_iterator<const_slang::ast::EvalContext::Frame_*> it_1;
  reverse_iterator<const_slang::ast::EvalContext::Frame_*> itEnd;
  reverse_iterator<const_slang::ast::EvalContext::Frame_*> it;
  reverse_view<std::ranges::ref_view<const_slang::SmallVector<slang::ast::EvalContext::Frame,_2UL>_>_>
  reversed;
  ptrdiff_t end;
  ptrdiff_t start;
  Frame *frame;
  reverse_iterator<const_slang::ast::EvalContext::Frame_*> __end3;
  reverse_iterator<const_slang::ast::EvalContext::Frame_*> __begin3;
  reverse_view<std::ranges::ref_view<const_slang::SmallVector<slang::ast::EvalContext::Frame,_2UL>_>_>
  *__range3;
  FormatBuffer buffer;
  size_t limit;
  SmallVector<slang::ast::EvalContext::Frame,_2UL> *in_stack_fffffffffffffcc8;
  SourceLocation in_stack_fffffffffffffcd0;
  reverse_view<std::ranges::ref_view<const_slang::SmallVector<slang::ast::EvalContext::Frame,_2UL>_>_>
  *in_stack_fffffffffffffcd8;
  SourceLocation noteLocation;
  undefined8 in_stack_fffffffffffffce0;
  DiagCode noteCode;
  reverse_iterator<const_slang::ast::EvalContext::Frame_*> local_2d8 [3];
  SourceLocation local_2c0;
  undefined4 local_2b4;
  reverse_iterator<const_slang::ast::EvalContext::Frame_*> local_2a0 [2];
  reverse_view<std::ranges::ref_view<const_slang::SmallVector<slang::ast::EvalContext::Frame,_2UL>_>_>
  *local_290;
  long local_288;
  ulong local_280;
  reference local_278;
  reverse_iterator<const_slang::ast::EvalContext::Frame_*> local_268 [3];
  undefined1 local_250 [8];
  reverse_view<std::ranges::ref_view<const_slang::SmallVector<slang::ast::EvalContext::Frame,_2UL>_>_>
  *local_248;
  undefined1 *local_240;
  ulong local_18;
  SourceLocation local_10;
  
  local_10 = in_RSI;
  this_00 = getCompilation((EvalContext *)0x89c929);
  pCVar2 = Compilation::getOptions(this_00);
  local_18 = (ulong)pCVar2->maxConstexprBacktrace;
  sVar3 = SmallVectorBase<slang::ast::EvalContext::Frame>::size
                    ((SmallVectorBase<slang::ast::EvalContext::Frame> *)(in_RDI + 0x50));
  if ((local_18 < sVar3) && (local_18 != 0)) {
    local_280 = local_18 >> 1;
    local_288 = local_280 + (local_18 & 1);
    local_290 = std::ranges::views::_Reverse::
                operator()<const_slang::SmallVector<slang::ast::EvalContext::Frame,_2UL>_&>
                          ((_Reverse *)in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8);
    std::ranges::
    reverse_view<std::ranges::ref_view<const_slang::SmallVector<slang::ast::EvalContext::Frame,_2UL>_>_>
    ::begin(in_stack_fffffffffffffcd8);
    std::reverse_iterator<const_slang::ast::EvalContext::Frame_*>::operator+
              ((reverse_iterator<const_slang::ast::EvalContext::Frame_*> *)in_stack_fffffffffffffcd8
               ,(difference_type)in_stack_fffffffffffffcd0);
    while( true ) {
      bVar1 = std::operator==<const_slang::ast::EvalContext::Frame_*>
                        ((reverse_iterator<const_slang::ast::EvalContext::Frame_*> *)
                         in_stack_fffffffffffffcd0,
                         (reverse_iterator<const_slang::ast::EvalContext::Frame_*> *)
                         in_stack_fffffffffffffcc8);
      noteCode = SUB84((ulong)in_stack_fffffffffffffce0 >> 0x20,0);
      if (((bVar1 ^ 0xffU) & 1) == 0) break;
      std::reverse_iterator<const_slang::ast::EvalContext::Frame_*>::operator*(local_2a0);
      reportFrame(in_stack_00000030,in_stack_00000028);
      std::reverse_iterator<const_slang::ast::EvalContext::Frame_*>::operator++
                ((reverse_iterator<const_slang::ast::EvalContext::Frame_*> *)
                 in_stack_fffffffffffffcd8,in_stack_fffffffffffffcd0._4_4_);
    }
    local_2b4 = 0x21000c;
    noteLocation = local_10;
    std::ranges::
    reverse_view<std::ranges::ref_view<const_slang::SmallVector<slang::ast::EvalContext::Frame,_2UL>_>_>
    ::begin((reverse_view<std::ranges::ref_view<const_slang::SmallVector<slang::ast::EvalContext::Frame,_2UL>_>_>
             *)local_10);
    std::reverse_iterator<const_slang::ast::EvalContext::Frame_*>::operator+
              ((reverse_iterator<const_slang::ast::EvalContext::Frame_*> *)noteLocation,
               (difference_type)in_stack_fffffffffffffcd0);
    pFVar4 = std::reverse_iterator<const_slang::ast::EvalContext::Frame_*>::operator->
                       ((reverse_iterator<const_slang::ast::EvalContext::Frame_*> *)
                        in_stack_fffffffffffffcd0);
    local_2c0 = pFVar4->callLocation;
    this_01 = Diagnostic::addNote((Diagnostic *)in_stack_fffffffffffffcd0,noteCode,noteLocation);
    SmallVectorBase<slang::ast::EvalContext::Frame>::size
              ((SmallVectorBase<slang::ast::EvalContext::Frame> *)(in_RDI + 0x50));
    Diagnostic::operator<<<unsigned_long>(this_01,(unsigned_long)noteLocation);
    std::ranges::
    reverse_view<std::ranges::ref_view<const_slang::SmallVector<slang::ast::EvalContext::Frame,_2UL>_>_>
    ::end((reverse_view<std::ranges::ref_view<const_slang::SmallVector<slang::ast::EvalContext::Frame,_2UL>_>_>
           *)noteLocation);
    std::reverse_iterator<const_slang::ast::EvalContext::Frame_*>::operator-
              ((reverse_iterator<const_slang::ast::EvalContext::Frame_*> *)noteLocation,
               (difference_type)in_stack_fffffffffffffcd0);
    std::ranges::
    reverse_view<std::ranges::ref_view<const_slang::SmallVector<slang::ast::EvalContext::Frame,_2UL>_>_>
    ::end((reverse_view<std::ranges::ref_view<const_slang::SmallVector<slang::ast::EvalContext::Frame,_2UL>_>_>
           *)noteLocation);
    while (bVar1 = std::operator==<const_slang::ast::EvalContext::Frame_*>
                             ((reverse_iterator<const_slang::ast::EvalContext::Frame_*> *)
                              in_stack_fffffffffffffcd0,
                              (reverse_iterator<const_slang::ast::EvalContext::Frame_*> *)
                              in_stack_fffffffffffffcc8), ((bVar1 ^ 0xffU) & 1) != 0) {
      in_stack_fffffffffffffcd0 = local_10;
      std::reverse_iterator<const_slang::ast::EvalContext::Frame_*>::operator*(local_2d8);
      reportFrame(in_stack_00000030,in_stack_00000028);
      std::reverse_iterator<const_slang::ast::EvalContext::Frame_*>::operator++
                ((reverse_iterator<const_slang::ast::EvalContext::Frame_*> *)noteLocation,
                 in_stack_fffffffffffffcd0._4_4_);
    }
  }
  else {
    FormatBuffer::FormatBuffer((FormatBuffer *)in_stack_fffffffffffffcd0);
    local_248 = std::ranges::views::_Reverse::
                operator()<const_slang::SmallVector<slang::ast::EvalContext::Frame,_2UL>_&>
                          ((_Reverse *)in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8);
    local_240 = local_250;
    std::ranges::
    reverse_view<std::ranges::ref_view<const_slang::SmallVector<slang::ast::EvalContext::Frame,_2UL>_>_>
    ::begin(in_stack_fffffffffffffcd8);
    std::ranges::
    reverse_view<std::ranges::ref_view<const_slang::SmallVector<slang::ast::EvalContext::Frame,_2UL>_>_>
    ::end(in_stack_fffffffffffffcd8);
    while (bVar1 = std::operator==<const_slang::ast::EvalContext::Frame_*>
                             ((reverse_iterator<const_slang::ast::EvalContext::Frame_*> *)
                              in_stack_fffffffffffffcd0,
                              (reverse_iterator<const_slang::ast::EvalContext::Frame_*> *)
                              in_stack_fffffffffffffcc8), ((bVar1 ^ 0xffU) & 1) != 0) {
      local_278 = std::reverse_iterator<const_slang::ast::EvalContext::Frame_*>::operator*
                            (local_268);
      reportFrame(in_stack_00000030,in_stack_00000028);
      std::reverse_iterator<const_slang::ast::EvalContext::Frame_*>::operator++(local_268);
    }
    FormatBuffer::~FormatBuffer((FormatBuffer *)0x89ca7e);
  }
  return;
}

Assistant:

void EvalContext::reportStack(Diagnostic& diag) const {
    const size_t limit = getCompilation().getOptions().maxConstexprBacktrace;
    if (stack.size() <= limit || limit == 0) {
        FormatBuffer buffer;
        for (const Frame& frame : std::views::reverse(stack))
            reportFrame(diag, frame);
        return;
    }

    const ptrdiff_t start = ptrdiff_t(limit / 2);
    const ptrdiff_t end = start + ptrdiff_t(limit % 2);
    auto reversed = std::views::reverse(stack);
    for (auto it = reversed.begin(), itEnd = it + start; it != itEnd; it++)
        reportFrame(diag, *it);

    diag.addNote(diag::NoteSkippingFrames, (reversed.begin() + start)->callLocation)
        << stack.size() - limit;

    for (auto it = reversed.end() - end, itEnd = reversed.end(); it != itEnd; it++)
        reportFrame(diag, *it);
}